

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zgemv.c
# Opt level: O2

void zgemv_(char *trans,integer *m,integer *n,doublecomplex *alpha,doublecomplex *a,integer *lda,
           doublecomplex *x,integer *incx,doublecomplex *beta,doublecomplex *y,integer *incy)

{
  undefined8 *puVar1;
  double *pdVar2;
  double dVar3;
  byte bVar4;
  double dVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  integer *piVar10;
  ulong uVar11;
  doublecomplex *pdVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  double *pdVar16;
  int iVar17;
  uint *puVar18;
  ulong uVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  doublecomplex *pdVar23;
  bool bVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  int local_9c;
  doublecomplex z__3;
  ulong local_78;
  
  bVar4 = *trans;
  if ((bVar4 - 0x43 < 0x12) && ((0x20801U >> (bVar4 - 0x43 & 0x1f) & 1) != 0)) {
    uVar6 = *m;
    if ((int)uVar6 < 0) {
      z__3.r._0_4_ = 2;
    }
    else {
      iVar22 = *n;
      if (iVar22 < 0) {
        z__3.r._0_4_ = 3;
      }
      else {
        iVar20 = *lda;
        if (iVar20 < (int)(uVar6 + (uVar6 == 0))) {
          z__3.r._0_4_ = 6;
        }
        else {
          iVar15 = *incx;
          uVar14 = (ulong)iVar15;
          if (uVar14 == 0) {
            z__3.r._0_4_ = 8;
          }
          else {
            iVar17 = *incy;
            local_78 = (ulong)iVar17;
            if (local_78 != 0) {
              if (iVar22 == 0 || uVar6 == 0) {
                return;
              }
              if ((((((alpha->r == 0.0) && (!NAN(alpha->r))) && (alpha->i == 0.0)) &&
                   ((!NAN(alpha->i) && (beta->r == 1.0)))) && (!NAN(beta->r))) &&
                 ((beta->i == 0.0 && (!NAN(beta->i))))) {
                return;
              }
              puVar18 = (uint *)n;
              if (bVar4 == 0x4e) {
                puVar18 = (uint *)m;
              }
              uVar13 = *puVar18;
              uVar11 = (ulong)uVar13;
              local_9c = 1;
              if (iVar15 < 1) {
                piVar10 = m;
                if (bVar4 == 0x4e) {
                  piVar10 = n;
                }
                local_9c = 1 - (*piVar10 + -1) * iVar15;
              }
              iVar7 = 1 - (uVar13 - 1) * iVar17;
              if (0 < iVar17) {
                iVar7 = 1;
              }
              dVar25 = beta->r;
              if ((((dVar25 != 1.0) || (NAN(dVar25))) || (beta->i != 0.0)) || (NAN(beta->i))) {
                if (iVar17 == 1) {
                  if (((dVar25 != 0.0) || (NAN(dVar25))) || ((beta->i != 0.0 || (NAN(beta->i))))) {
                    lVar8 = 0;
                    if ((int)uVar13 < 1) {
                      uVar11 = 0;
                    }
                    for (; uVar11 * 0x10 != lVar8; lVar8 = lVar8 + 0x10) {
                      dVar25 = beta->r;
                      dVar27 = beta->i;
                      pdVar16 = (double *)((long)&y->r + lVar8);
                      dVar26 = *pdVar16;
                      dVar3 = pdVar16[1];
                      pdVar16 = (double *)((long)&y->r + lVar8);
                      *pdVar16 = dVar25 * dVar26 + dVar3 * -dVar27;
                      pdVar16[1] = dVar25 * dVar3 + dVar26 * dVar27;
                    }
                  }
                  else {
                    uVar19 = 0;
                    if ((int)uVar13 < 1) {
                      uVar11 = uVar19;
                    }
                    for (; uVar11 * 0x10 != uVar19; uVar19 = uVar19 + 0x10) {
                      puVar1 = (undefined8 *)((long)&y->r + uVar19);
                      *puVar1 = 0;
                      puVar1[1] = 0;
                    }
                  }
                }
                else if (((dVar25 != 0.0) || (NAN(dVar25))) || ((beta->i != 0.0 || (NAN(beta->i)))))
                {
                  uVar19 = 0;
                  if (0 < (int)uVar13) {
                    uVar19 = uVar11;
                  }
                  pdVar12 = y + (long)iVar7 + -1;
                  while (iVar9 = (int)uVar19, uVar19 = (ulong)(iVar9 - 1), iVar9 != 0) {
                    dVar25 = beta->r;
                    dVar27 = beta->i;
                    dVar26 = pdVar12->r;
                    pdVar12->r = dVar25 * dVar26 + pdVar12->i * -dVar27;
                    pdVar12->i = dVar25 * pdVar12->i + dVar26 * dVar27;
                    pdVar12 = pdVar12 + local_78;
                  }
                }
                else {
                  uVar19 = 0;
                  if (0 < (int)uVar13) {
                    uVar19 = uVar11;
                  }
                  pdVar12 = y + (long)iVar7 + -1;
                  while (iVar9 = (int)uVar19, uVar19 = (ulong)(iVar9 - 1), iVar9 != 0) {
                    pdVar12->r = 0.0;
                    pdVar12->i = 0.0;
                    pdVar12 = pdVar12 + local_78;
                  }
                }
              }
              if ((((alpha->r == 0.0) && (!NAN(alpha->r))) && (alpha->i == 0.0)) && (!NAN(alpha->i))
                 ) {
                return;
              }
              if (*trans != 'N') {
                if (iVar15 == 1) {
                  iVar15 = 0;
                  for (iVar20 = 1; iVar20 <= iVar22; iVar20 = iVar20 + 1) {
                    if (bVar4 == 0x54) {
                      uVar14 = 0;
                      if (0 < (int)uVar6) {
                        uVar14 = (ulong)uVar6;
                      }
                      dVar25 = 0.0;
                      dVar27 = 0.0;
                      pdVar12 = x;
                      pdVar16 = &a->i;
                      while (bVar24 = uVar14 != 0, uVar14 = uVar14 - 1, bVar24) {
                        dVar25 = dVar25 + pdVar16[(long)(*lda * iVar15) * 2 + -1] * pdVar12->r +
                                          pdVar12->i * -pdVar16[(long)(*lda * iVar15) * 2];
                        dVar27 = dVar27 + pdVar16[(long)(*lda * iVar15) * 2 + -1] * pdVar12->i +
                                          pdVar12->r * pdVar16[(long)(*lda * iVar15) * 2];
                        pdVar16 = pdVar16 + 2;
                        pdVar12 = pdVar12 + 1;
                      }
                    }
                    else {
                      dVar25 = 0.0;
                      dVar27 = 0.0;
                      pdVar12 = a;
                      pdVar23 = x;
                      for (lVar8 = 1; lVar8 <= (int)uVar6; lVar8 = lVar8 + 1) {
                        d_cnjg(&z__3,pdVar12 + (long)iVar15 * (long)*lda);
                        dVar25 = dVar25 + (double)CONCAT44(z__3.r._4_4_,z__3.r._0_4_) * pdVar23->r +
                                          pdVar23->i * -z__3.i;
                        dVar27 = dVar27 + (double)CONCAT44(z__3.r._4_4_,z__3.r._0_4_) * pdVar23->i +
                                          pdVar23->r * z__3.i;
                        uVar6 = *m;
                        pdVar12 = pdVar12 + 1;
                        pdVar23 = pdVar23 + 1;
                      }
                      local_78 = (ulong)(uint)*incy;
                      iVar22 = *n;
                    }
                    dVar26 = alpha->r;
                    dVar3 = alpha->i;
                    dVar5 = y[(long)iVar7 + -1].i;
                    y[(long)iVar7 + -1].r =
                         y[(long)iVar7 + -1].r + dVar26 * dVar25 + dVar27 * -dVar3;
                    y[(long)iVar7 + -1].i = dVar5 + dVar26 * dVar27 + dVar25 * dVar3;
                    iVar7 = iVar7 + (int)local_78;
                    iVar15 = iVar15 + 1;
                  }
                  return;
                }
                iVar15 = 0;
                for (iVar20 = 1; iVar20 <= iVar22; iVar20 = iVar20 + 1) {
                  if (bVar4 == 0x54) {
                    uVar13 = 0;
                    if (0 < (int)uVar6) {
                      uVar13 = uVar6;
                    }
                    dVar25 = 0.0;
                    dVar27 = 0.0;
                    pdVar12 = x + (long)local_9c + -1;
                    for (lVar8 = 0; uVar13 != (uint)lVar8; lVar8 = lVar8 + 1) {
                      lVar21 = (long)*lda * (long)iVar15 + lVar8;
                      dVar25 = dVar25 + a[lVar21].r * pdVar12->r + pdVar12->i * -a[lVar21].i;
                      dVar27 = dVar27 + a[lVar21].r * pdVar12->i + pdVar12->r * a[lVar21].i;
                      pdVar12 = pdVar12 + (int)uVar14;
                    }
                  }
                  else {
                    dVar25 = 0.0;
                    dVar27 = 0.0;
                    iVar22 = local_9c;
                    for (lVar8 = 0; (int)lVar8 + 1 <= (int)uVar6; lVar8 = lVar8 + 1) {
                      d_cnjg(&z__3,a + (long)*lda * (long)iVar15 + lVar8);
                      dVar26 = x[(long)iVar22 + -1].r;
                      dVar3 = x[(long)iVar22 + -1].i;
                      dVar25 = dVar25 + (double)CONCAT44(z__3.r._4_4_,z__3.r._0_4_) * dVar26 +
                                        dVar3 * -z__3.i;
                      dVar27 = dVar27 + (double)CONCAT44(z__3.r._4_4_,z__3.r._0_4_) * dVar3 +
                                        dVar26 * z__3.i;
                      uVar14 = (ulong)(uint)*incx;
                      iVar22 = iVar22 + *incx;
                      uVar6 = *m;
                    }
                    local_78 = (ulong)(uint)*incy;
                    iVar22 = *n;
                  }
                  dVar26 = alpha->r;
                  dVar3 = alpha->i;
                  dVar5 = y[(long)iVar7 + -1].i;
                  y[(long)iVar7 + -1].r = y[(long)iVar7 + -1].r + dVar26 * dVar25 + dVar27 * -dVar3;
                  y[(long)iVar7 + -1].i = dVar5 + dVar26 * dVar27 + dVar25 * dVar3;
                  iVar7 = iVar7 + (int)local_78;
                  iVar15 = iVar15 + 1;
                }
                return;
              }
              if (iVar17 == 1) {
                lVar8 = (long)local_9c;
                iVar17 = 0;
                for (iVar15 = 1; iVar15 != iVar22 + 1; iVar15 = iVar15 + 1) {
                  dVar25 = x[lVar8 + -1].r;
                  dVar27 = x[lVar8 + -1].i;
                  if (((dVar25 != 0.0) || (NAN(dVar25))) || ((dVar27 != 0.0 || (NAN(dVar27))))) {
                    dVar26 = alpha->r * dVar25 - dVar27 * alpha->i;
                    dVar25 = alpha->r * dVar27 + dVar25 * alpha->i;
                    lVar21 = 0;
                    uVar11 = (ulong)(uVar6 + 1);
                    while (uVar11 = uVar11 - 1, uVar11 != 0) {
                      pdVar16 = (double *)((long)&a[iVar17].r + lVar21);
                      dVar27 = *pdVar16;
                      dVar3 = pdVar16[1];
                      pdVar16 = (double *)((long)&y->r + lVar21);
                      dVar5 = pdVar16[1];
                      pdVar2 = (double *)((long)&y->r + lVar21);
                      *pdVar2 = *pdVar16 + dVar27 * dVar26 + dVar3 * -dVar25;
                      pdVar2[1] = dVar5 + dVar3 * dVar26 + dVar27 * dVar25;
                      lVar21 = lVar21 + 0x10;
                    }
                  }
                  lVar8 = lVar8 + uVar14;
                  iVar17 = iVar17 + iVar20;
                }
                return;
              }
              lVar8 = (long)local_9c;
              iVar17 = 0;
              for (iVar15 = 1; iVar15 != iVar22 + 1; iVar15 = iVar15 + 1) {
                dVar25 = x[lVar8 + -1].r;
                dVar27 = x[lVar8 + -1].i;
                if (((dVar25 != 0.0) || (NAN(dVar25))) || ((dVar27 != 0.0 || (NAN(dVar27))))) {
                  dVar26 = alpha->r * dVar25 - dVar27 * alpha->i;
                  dVar25 = alpha->r * dVar27 + dVar25 * alpha->i;
                  pdVar12 = y + (long)iVar7 + -1;
                  uVar13 = uVar6;
                  iVar9 = iVar17;
                  while (bVar24 = uVar13 != 0, uVar13 = uVar13 - 1, bVar24) {
                    dVar27 = a[iVar9].r;
                    dVar3 = a[iVar9].i;
                    pdVar12->r = pdVar12->r + dVar27 * dVar26 + dVar3 * -dVar25;
                    pdVar12->i = pdVar12->i + dVar3 * dVar26 + dVar27 * dVar25;
                    pdVar12 = pdVar12 + local_78;
                    iVar9 = iVar9 + 1;
                  }
                }
                lVar8 = lVar8 + uVar14;
                iVar17 = iVar17 + iVar20;
              }
              return;
            }
            z__3.r._0_4_ = 0xb;
          }
        }
      }
    }
  }
  else {
    z__3.r._0_4_ = 1;
  }
  input_error("ZGEMV ",(int *)&z__3);
  return;
}

Assistant:

void zgemv_(char *trans, integer *m, integer *n, 
	doublecomplex *alpha, doublecomplex *a, integer *lda, doublecomplex *
	x, integer *incx, doublecomplex *beta, doublecomplex *y, integer *
	incy)
{


    /* System generated locals */

    doublecomplex z__1, z__2, z__3;

    /* Builtin functions */
    void d_cnjg(doublecomplex *, doublecomplex *);

    /* Local variables */
    integer info;
    doublecomplex temp;
    integer lenx, leny, i, j;
    integer ix, iy, jx, jy, kx, ky;
    logical noconj;

    extern int input_error(char *, int *);

/*  Purpose   
    =======   

    ZGEMV  performs one of the matrix-vector operations   

       y := alpha*A*x + beta*y,   or   y := alpha*A'*x + beta*y,   or   

       y := alpha*conjg( A' )*x + beta*y,   

    where alpha and beta are scalars, x and y are vectors and A is an   
    m by n matrix.   

    Parameters   
    ==========   

    TRANS  - CHARACTER*1.   
             On entry, TRANS specifies the operation to be performed as   
             follows:   

                TRANS = 'N' or 'n'   y := alpha*A*x + beta*y.   

                TRANS = 'T' or 't'   y := alpha*A'*x + beta*y.   

                TRANS = 'C' or 'c'   y := alpha*conjg( A' )*x + beta*y.   

             Unchanged on exit.   

    M      - INTEGER.   
             On entry, M specifies the number of rows of the matrix A.   
             M must be at least zero.   
             Unchanged on exit.   

    N      - INTEGER.   
             On entry, N specifies the number of columns of the matrix A. 
  
             N must be at least zero.   
             Unchanged on exit.   

    ALPHA  - COMPLEX*16      .   
             On entry, ALPHA specifies the scalar alpha.   
             Unchanged on exit.   

    A      - COMPLEX*16       array of DIMENSION ( LDA, n ).   
             Before entry, the leading m by n part of the array A must   
             contain the matrix of coefficients.   
             Unchanged on exit.   

    LDA    - INTEGER.   
             On entry, LDA specifies the first dimension of A as declared 
  
             in the calling (sub) program. LDA must be at least   
             max( 1, m ).   
             Unchanged on exit.   

    X      - COMPLEX*16       array of DIMENSION at least   
             ( 1 + ( n - 1 )*abs( INCX ) ) when TRANS = 'N' or 'n'   
             and at least   
             ( 1 + ( m - 1 )*abs( INCX ) ) otherwise.   
             Before entry, the incremented array X must contain the   
             vector x.   
             Unchanged on exit.   

    INCX   - INTEGER.   
             On entry, INCX specifies the increment for the elements of   
             X. INCX must not be zero.   
             Unchanged on exit.   

    BETA   - COMPLEX*16      .   
             On entry, BETA specifies the scalar beta. When BETA is   
             supplied as zero then Y need not be set on input.   
             Unchanged on exit.   

    Y      - COMPLEX*16       array of DIMENSION at least   
             ( 1 + ( m - 1 )*abs( INCY ) ) when TRANS = 'N' or 'n'   
             and at least   
             ( 1 + ( n - 1 )*abs( INCY ) ) otherwise.   
             Before entry with BETA non-zero, the incremented array Y   
             must contain the vector y. On exit, Y is overwritten by the 
  
             updated vector y.   

    INCY   - INTEGER.   
             On entry, INCY specifies the increment for the elements of   
             Y. INCY must not be zero.   
             Unchanged on exit.   


    Level 2 Blas routine.   

    -- Written on 22-October-1986.   
       Jack Dongarra, Argonne National Lab.   
       Jeremy Du Croz, Nag Central Office.   
       Sven Hammarling, Nag Central Office.   
       Richard Hanson, Sandia National Labs.   

       Test the input parameters.   

    
   Parameter adjustments   
       Function Body */
#define X(I) x[(I)-1]
#define Y(I) y[(I)-1]

#define A(I,J) a[(I)-1 + ((J)-1)* ( *lda)]

    info = 0;
    if ( strncmp(trans, "N", 1)!=0 && strncmp(trans, "T", 1)!=0 &&
	 strncmp(trans, "C", 1)!=0 ) {
	info = 1;
    } else if (*m < 0) {
	info = 2;
    } else if (*n < 0) {
	info = 3;
    } else if (*lda < max(1,*m)) {
	info = 6;
    } else if (*incx == 0) {
	info = 8;
    } else if (*incy == 0) {
	info = 11;
    }
    if (info != 0) {
	input_error("ZGEMV ", &info);
	return;
    }

/*     Quick return if possible. */

    if (*m == 0 || *n == 0 || (alpha->r == 0. && alpha->i == 0.
			       && beta->r == 1. && beta->i == 0.)) {
	return;
    }

    noconj = ( strncmp(trans, "T", 1)==0 );

/*     Set  LENX  and  LENY, the lengths of the vectors x and y, and set 
       up the start points in  X  and  Y. */

    if (strncmp(trans, "N", 1)==0) {
	lenx = *n;
	leny = *m;
    } else {
	lenx = *m;
	leny = *n;
    }
    if (*incx > 0) {
	kx = 1;
    } else {
	kx = 1 - (lenx - 1) * *incx;
    }
    if (*incy > 0) {
	ky = 1;
    } else {
	ky = 1 - (leny - 1) * *incy;
    }

/*     Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through A.   

       First form  y := beta*y. */

    if (beta->r != 1. || beta->i != 0.) {
	if (*incy == 1) {
	    if (beta->r == 0. && beta->i == 0.) {
		for (i = 1; i <= leny; ++i) {
		    Y(i).r = 0., Y(i).i = 0.;
/* L10: */
		}
	    } else {
		for (i = 1; i <= leny; ++i) {
		    z__1.r = beta->r * Y(i).r - beta->i * Y(i).i, 
			    z__1.i = beta->r * Y(i).i + beta->i * Y(i)
			    .r;
		    Y(i).r = z__1.r, Y(i).i = z__1.i;
/* L20: */
		}
	    }
	} else {
	    iy = ky;
	    if (beta->r == 0. && beta->i == 0.) {
		for (i = 1; i <= leny; ++i) {
		    Y(iy).r = 0., Y(iy).i = 0.;
		    iy += *incy;
/* L30: */
		}
	    } else {
		for (i = 1; i <= leny; ++i) {
		    z__1.r = beta->r * Y(iy).r - beta->i * Y(iy).i, 
			    z__1.i = beta->r * Y(iy).i + beta->i * Y(iy)
			    .r;
		    Y(iy).r = z__1.r, Y(iy).i = z__1.i;
		    iy += *incy;
/* L40: */
		}
	    }
	}
    }
    if (alpha->r == 0. && alpha->i == 0.) {
	return;
    }
    if (strncmp(trans, "N", 1)==0) {

/*        Form  y := alpha*A*x + y. */

	jx = kx;
	if (*incy == 1) {
	    for (j = 1; j <= *n; ++j) {
		if (X(jx).r != 0. || X(jx).i != 0.) {
		    z__1.r = alpha->r * X(jx).r - alpha->i * X(jx).i, 
			    z__1.i = alpha->r * X(jx).i + alpha->i * X(jx)
			    .r;
		    temp.r = z__1.r, temp.i = z__1.i;
		    for (i = 1; i <= *m; ++i) {
			z__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				z__2.i = temp.r * A(i,j).i + temp.i * A(i,j)
				.r;
			z__1.r = Y(i).r + z__2.r, z__1.i = Y(i).i + 
				z__2.i;
			Y(i).r = z__1.r, Y(i).i = z__1.i;
/* L50: */
		    }
		}
		jx += *incx;
/* L60: */
	    }
	} else {
	    for (j = 1; j <= *n; ++j) {
		if (X(jx).r != 0. || X(jx).i != 0.) {
		    z__1.r = alpha->r * X(jx).r - alpha->i * X(jx).i, 
			    z__1.i = alpha->r * X(jx).i + alpha->i * X(jx)
			    .r;
		    temp.r = z__1.r, temp.i = z__1.i;
		    iy = ky;
		    for (i = 1; i <= *m; ++i) {
			z__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				z__2.i = temp.r * A(i,j).i + temp.i * A(i,j)
				.r;
			z__1.r = Y(iy).r + z__2.r, z__1.i = Y(iy).i + 
				z__2.i;
			Y(iy).r = z__1.r, Y(iy).i = z__1.i;
			iy += *incy;
/* L70: */
		    }
		}
		jx += *incx;
/* L80: */
	    }
	}
    } else {

/*        Form  y := alpha*A'*x + y  or  y := alpha*conjg( A' )*x + y.
 */

	jy = ky;
	if (*incx == 1) {
	    for (j = 1; j <= *n; ++j) {
		temp.r = 0., temp.i = 0.;
		if (noconj) {
		    for (i = 1; i <= *m; ++i) {
			z__2.r = A(i,j).r * X(i).r - A(i,j).i * X(i)
				.i, z__2.i = A(i,j).r * X(i).i + A(i,j)
				.i * X(i).r;
			z__1.r = temp.r + z__2.r, z__1.i = temp.i + z__2.i;
			temp.r = z__1.r, temp.i = z__1.i;
/* L90: */
		    }
		} else {
		    for (i = 1; i <= *m; ++i) {
			d_cnjg(&z__3, &A(i,j));
			z__2.r = z__3.r * X(i).r - z__3.i * X(i).i, 
				z__2.i = z__3.r * X(i).i + z__3.i * X(i)
				.r;
			z__1.r = temp.r + z__2.r, z__1.i = temp.i + z__2.i;
			temp.r = z__1.r, temp.i = z__1.i;
/* L100: */
		    }
		}
		z__2.r = alpha->r * temp.r - alpha->i * temp.i, z__2.i = 
			alpha->r * temp.i + alpha->i * temp.r;
		z__1.r = Y(jy).r + z__2.r, z__1.i = Y(jy).i + z__2.i;
		Y(jy).r = z__1.r, Y(jy).i = z__1.i;
		jy += *incy;
/* L110: */
	    }
	} else {
	    for (j = 1; j <= *n; ++j) {
		temp.r = 0., temp.i = 0.;
		ix = kx;
		if (noconj) {
		    for (i = 1; i <= *m; ++i) {
			z__2.r = A(i,j).r * X(ix).r - A(i,j).i * X(ix)
				.i, z__2.i = A(i,j).r * X(ix).i + A(i,j)
				.i * X(ix).r;
			z__1.r = temp.r + z__2.r, z__1.i = temp.i + z__2.i;
			temp.r = z__1.r, temp.i = z__1.i;
			ix += *incx;
/* L120: */
		    }
		} else {
		    for (i = 1; i <= *m; ++i) {
			d_cnjg(&z__3, &A(i,j));
			z__2.r = z__3.r * X(ix).r - z__3.i * X(ix).i, 
				z__2.i = z__3.r * X(ix).i + z__3.i * X(ix)
				.r;
			z__1.r = temp.r + z__2.r, z__1.i = temp.i + z__2.i;
			temp.r = z__1.r, temp.i = z__1.i;
			ix += *incx;
/* L130: */
		    }
		}
		z__2.r = alpha->r * temp.r - alpha->i * temp.i, z__2.i = 
			alpha->r * temp.i + alpha->i * temp.r;
		z__1.r = Y(jy).r + z__2.r, z__1.i = Y(jy).i + z__2.i;
		Y(jy).r = z__1.r, Y(jy).i = z__1.i;
		jy += *incy;
/* L140: */
	    }
	}
    }

    return;

/*     End of ZGEMV . */

}